

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OdiPublisher.cpp
# Opt level: O1

bool OdiPublisher::CopyFile(char *source_file_name,char *dest_file_name)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  FILE *__s;
  uint *puVar3;
  size_t __n;
  size_t sVar4;
  char *__format;
  bool bVar5;
  char line [512];
  undefined1 auStack_228 [512];
  
  __stream = (FILE *)ithi_file_open(source_file_name,"r");
  if (__stream == (FILE *)0x0) {
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    __format = "Could not read file %s, err: %d\n";
    dest_file_name = source_file_name;
  }
  else {
    __s = (FILE *)ithi_file_open(dest_file_name,"w");
    if (__s != (FILE *)0x0) {
      bVar5 = true;
      goto LAB_001a5ced;
    }
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    __format = "Could not write file %s, err: %d\n";
  }
  __s = (FILE *)0x0;
  printf(__format,dest_file_name,(ulong)uVar1);
  bVar5 = false;
LAB_001a5ced:
  do {
    if (!bVar5) break;
    __n = fread(auStack_228,1,0x200,__stream);
    if (__n == 0) {
      iVar2 = feof(__stream);
      bVar5 = iVar2 == 0;
    }
    else {
      sVar4 = fwrite(auStack_228,1,__n,__s);
      bVar5 = sVar4 == 0;
    }
    bVar5 = !bVar5;
  } while (__n != 0);
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  if (__s != (FILE *)0x0) {
    fclose(__s);
  }
  return bVar5;
}

Assistant:

bool OdiPublisher::CopyFile(const char * source_file_name, const char * dest_file_name)
{
    bool ret = true;
    char line[512];
    FILE * F_out = NULL;
    FILE* F_in = ithi_file_open(source_file_name, "r");

    if (F_in != NULL)
    {
        F_out = ithi_file_open(dest_file_name, "w");
        if (F_out == NULL) {
            printf("Could not write file %s, err: %d\n", dest_file_name, errno);
            ret = false;
        }
    }
    else {
        printf("Could not read file %s, err: %d\n", source_file_name, errno);
        ret = false;
    }

    while (ret) {
        size_t nb_read = fread(line, 1, sizeof(line), F_in);

        if (nb_read > 0) {
            ret = fwrite(line, 1, nb_read, F_out) > 0;
        }
        else {
            ret = feof(F_in) != 0;
            break;
        }
    }

    if (F_in != NULL) {
        fclose(F_in);
    }

    if (F_out != NULL) {
        fclose(F_out);
    }

    return ret;
}